

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprImpliesNonNullRow(Expr *p,int iTab,int isRJ)

{
  u8 uVar1;
  int iVar2;
  Expr *pExpr;
  uint uVar3;
  long in_FS_OFFSET;
  undefined1 local_58 [36];
  ushort uStack_34;
  anon_union_8_18_67db040d_for_u aStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pExpr = sqlite3ExprSkipCollateAndLikely(p);
  if (pExpr == (Expr *)0x0) {
    uVar3 = 0;
  }
  else {
    stack0xffffffffffffffc8 = &DAT_aaaaaaaaaaaaaaaa;
    aStack_30.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    uVar1 = pExpr->op;
    if (uVar1 == '4') {
      pExpr = pExpr->pLeft;
    }
    else {
      uVar3 = 1;
      while (uVar1 == ',') {
        iVar2 = sqlite3ExprImpliesNonNullRow(pExpr->pLeft,iTab,isRJ);
        if (iVar2 != 0) goto LAB_001754d9;
        pExpr = pExpr->pRight;
        uVar1 = pExpr->op;
      }
    }
    local_58._8_8_ = impliesNotNullRow;
    local_58._16_8_ = (_func_int_Walker_ptr_Select_ptr *)0x0;
    local_58._24_8_ = (_func_void_Walker_ptr_Select_ptr *)0x0;
    stack0xffffffffffffffc8 =
         (undefined1 *)(ulong)(CONCAT16(isRJ != 0,(int6)stack0xffffffffffffffc8) & 0xff0000ffffffff)
    ;
    aStack_30.n = iTab;
    sqlite3WalkExpr((Walker *)local_58,pExpr);
    uVar3 = (uint)uStack_34;
  }
LAB_001754d9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprImpliesNonNullRow(Expr *p, int iTab, int isRJ){
  Walker w;
  p = sqlite3ExprSkipCollateAndLikely(p);
  if( p==0 ) return 0;
  if( p->op==TK_NOTNULL ){
    p = p->pLeft;
  }else{
    while( p->op==TK_AND ){
      if( sqlite3ExprImpliesNonNullRow(p->pLeft, iTab, isRJ) ) return 1;
      p = p->pRight;
    }
  }
  w.xExprCallback = impliesNotNullRow;
  w.xSelectCallback = 0;
  w.xSelectCallback2 = 0;
  w.eCode = 0;
  w.mWFlags = isRJ!=0;
  w.u.iCur = iTab;
  sqlite3WalkExpr(&w, p);
  return w.eCode;
}